

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

bool cli::createPath(string *path)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char cVar4;
  string part;
  stat sb;
  long *local_e0 [2];
  long local_d0 [2];
  stat local_c0;
  
  cVar4 = (char)path;
  lVar2 = std::__cxx11::string::rfind(cVar4,0x2f);
  uVar3 = std::__cxx11::string::find(cVar4,0x2f);
  if (uVar3 < lVar2 + 1U) {
    do {
      std::__cxx11::string::substr((ulong)local_e0,(ulong)path);
      iVar1 = stat((char *)local_e0[0],&local_c0);
      if (((iVar1 != 0) || ((local_c0.st_mode & 0xf000) != 0x4000)) &&
         (iVar1 = mkdir((char *)local_e0[0],0x1ed), iVar1 != 0)) {
        if (local_e0[0] != local_d0) {
          operator_delete(local_e0[0],local_d0[0] + 1);
        }
        return false;
      }
      if (local_e0[0] != local_d0) {
        operator_delete(local_e0[0],local_d0[0] + 1);
      }
      uVar3 = std::__cxx11::string::find(cVar4,0x2f);
    } while (uVar3 < lVar2 + 1U);
  }
  return true;
}

Assistant:

bool createPath(const std::string &path)
	{
		std::string::size_type end = path.find_last_of('/')+1;
		for (std::string::size_type index = path.find_first_of('/', 0); index < end; index = path.find_first_of('/', index+1))
		{
			std::string part = path.substr(0, index);
			if (!isDirectory(part))
			{
#ifdef _WIN32
				if (CreateDirectoryA(part.c_str(), nullptr) == 0)
					return false;
#else
				if (mkdir(part.c_str(), S_IRWXU | S_IRGRP | S_IXGRP | S_IROTH | S_IXOTH) != 0)
					return false;
#endif
			}
		}

		return true;
	}